

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_newton.c
# Opt level: O0

SUNNonlinearSolver SUNNonlinSol_Newton(N_Vector y)

{
  _generic_N_Vector_Ops *__ptr;
  undefined8 *__s;
  N_Vector p_Var1;
  SUNNonlinearSolverContent_Newton content;
  SUNNonlinearSolver_Ops ops;
  SUNNonlinearSolver NLS;
  N_Vector y_local;
  
  if (y == (N_Vector)0x0) {
    y_local = (N_Vector)0x0;
  }
  else if ((((y->ops->nvclone == (_func_N_Vector_N_Vector *)0x0) ||
            (y->ops->nvdestroy == (_func_void_N_Vector *)0x0)) ||
           (y->ops->nvscale == (_func_void_realtype_N_Vector_N_Vector *)0x0)) ||
          (y->ops->nvlinearsum == (_func_void_realtype_N_Vector_realtype_N_Vector_N_Vector *)0x0)) {
    y_local = (N_Vector)0x0;
  }
  else {
    y_local = (N_Vector)malloc(0x10);
    if (y_local == (N_Vector)0x0) {
      y_local = (N_Vector)0x0;
    }
    else {
      __ptr = (_generic_N_Vector_Ops *)malloc(0x68);
      if (__ptr == (_generic_N_Vector_Ops *)0x0) {
        free(y_local);
        y_local = (N_Vector)0x0;
      }
      else {
        __ptr->nvgetvectorid = SUNNonlinSolGetType_Newton;
        __ptr->nvclone = SUNNonlinSolInitialize_Newton;
        __ptr->nvcloneempty = (_func_N_Vector_N_Vector *)0x0;
        __ptr->nvdestroy = SUNNonlinSolSolve_Newton;
        __ptr->nvspace = SUNNonlinSolFree_Newton;
        __ptr->nvgetarraypointer = SUNNonlinSolSetSysFn_Newton;
        __ptr->nvsetarraypointer = SUNNonlinSolSetLSetupFn_Newton;
        __ptr->nvlinearsum = SUNNonlinSolSetLSolveFn_Newton;
        __ptr->nvconst = SUNNonlinSolSetConvTestFn_Newton;
        __ptr->nvprod = SUNNonlinSolSetMaxIters_Newton;
        __ptr->nvdiv = SUNNonlinSolGetNumIters_Newton;
        __ptr->nvscale = SUNNonlinSolGetCurIter_Newton;
        __ptr->nvabs = SUNNonlinSolGetNumConvFails_Newton;
        __s = (undefined8 *)malloc(0x48);
        if (__s == (undefined8 *)0x0) {
          free(__ptr);
          free(y_local);
          y_local = (N_Vector)0x0;
        }
        else {
          memset(__s,0,0x48);
          *__s = 0;
          __s[1] = 0;
          __s[2] = 0;
          __s[3] = 0;
          p_Var1 = N_VClone(y);
          __s[4] = p_Var1;
          *(undefined4 *)(__s + 5) = 0;
          *(undefined4 *)((long)__s + 0x2c) = 0;
          *(undefined4 *)(__s + 6) = 3;
          __s[7] = 0;
          __s[8] = 0;
          if (__s[4] == 0) {
            free(__ptr);
            free(y_local);
            y_local = (N_Vector)0x0;
          }
          else {
            y_local->content = __s;
            y_local->ops = __ptr;
          }
        }
      }
    }
  }
  return (SUNNonlinearSolver)y_local;
}

Assistant:

SUNNonlinearSolver SUNNonlinSol_Newton(N_Vector y)
{
  SUNNonlinearSolver NLS;
  SUNNonlinearSolver_Ops ops;
  SUNNonlinearSolverContent_Newton content;

  /* Check that the supplied N_Vector is non-NULL */
  if (y == NULL) return(NULL);

  /* Check that the supplied N_Vector supports all required operations */
  if ( (y->ops->nvclone     == NULL) ||
       (y->ops->nvdestroy   == NULL) ||
       (y->ops->nvscale     == NULL) ||
       (y->ops->nvlinearsum == NULL) )
    return(NULL);

  /* Create nonlinear linear solver */
  NLS = NULL;
  NLS = (SUNNonlinearSolver) malloc(sizeof *NLS);
  if (NLS == NULL) return(NULL);

  /* Create linear solver operation structure */
  ops = NULL;
  ops = (SUNNonlinearSolver_Ops) malloc(sizeof *ops);
  if (ops == NULL) { free(NLS); return(NULL); }

  /* Attach operations */
  ops->gettype         = SUNNonlinSolGetType_Newton;
  ops->initialize      = SUNNonlinSolInitialize_Newton;
  ops->setup           = NULL; /* no setup needed */
  ops->solve           = SUNNonlinSolSolve_Newton;
  ops->free            = SUNNonlinSolFree_Newton;
  ops->setsysfn        = SUNNonlinSolSetSysFn_Newton;
  ops->setlsetupfn     = SUNNonlinSolSetLSetupFn_Newton;
  ops->setlsolvefn     = SUNNonlinSolSetLSolveFn_Newton;
  ops->setctestfn      = SUNNonlinSolSetConvTestFn_Newton;
  ops->setmaxiters     = SUNNonlinSolSetMaxIters_Newton;
  ops->getnumiters     = SUNNonlinSolGetNumIters_Newton;
  ops->getcuriter      = SUNNonlinSolGetCurIter_Newton;
  ops->getnumconvfails = SUNNonlinSolGetNumConvFails_Newton;

  /* Create content */
  content = NULL;
  content = (SUNNonlinearSolverContent_Newton) malloc(sizeof *content);
  if (content == NULL) { free(ops); free(NLS); return(NULL); }

  /* Initialize all components of content to 0/NULL */
  memset(content, 0, sizeof(struct _SUNNonlinearSolverContent_Newton));

  /* Fill content */
  content->Sys        = NULL;
  content->LSetup     = NULL;
  content->LSolve     = NULL;
  content->CTest      = NULL;
  content->delta      = N_VClone(y);
  content->jcur       = SUNFALSE;
  content->curiter    = 0;
  content->maxiters   = 3;
  content->niters     = 0;
  content->nconvfails = 0;

  /* check if clone was successful */
  if (content->delta == NULL) { free(ops); free(NLS); return(NULL); }

  /* Attach content and ops */
  NLS->content = content;
  NLS->ops     = ops;

  return(NLS);
}